

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  u8 uVar1;
  Schema *pSVar2;
  char *p;
  uint uVar3;
  int iVar4;
  int iVar5;
  Parse *pParse;
  Table *pTVar6;
  FKey *pFVar7;
  Index *pIVar8;
  Vdbe *p_00;
  VdbeOp *pVVar9;
  sqlite3 *psVar10;
  ulong uVar11;
  long lVar12;
  Schema **ppSVar13;
  uint uVar14;
  Vdbe *v;
  Column *pCVar15;
  char *pcVar16;
  int p1;
  Incrblob *pIVar17;
  uint uVar18;
  ulong uVar19;
  char *zErr;
  uint local_94;
  char *local_88;
  Incrblob *local_80;
  Parse *local_78;
  int local_6c;
  Table *local_68;
  char *local_60;
  uint local_54;
  char *local_50;
  VdbeOp *local_48;
  sqlite_int64 local_40;
  char *local_38;
  
  local_88 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_6c = wrFlag;
  local_60 = zTable;
  local_50 = zColumn;
  local_40 = iRow;
  local_38 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  local_80 = (Incrblob *)sqlite3DbMallocZero(db,0x38);
  if (local_80 != (Incrblob *)0x0) {
    if (db == (sqlite3 *)0x0) {
      pParse = (Parse *)sqlite3Malloc(0x250);
    }
    else {
      pParse = (Parse *)sqlite3DbMallocRawNN(db,0x250);
    }
    if (pParse != (Parse *)0x0) {
      local_94 = 0;
      uVar3 = 0;
      pIVar17 = local_80;
      local_78 = pParse;
      do {
        local_54 = uVar3;
        memset(pParse,0,0x250);
        pParse->db = db;
        sqlite3DbFree(db,local_88);
        local_88 = (char *)0x0;
        if (db->skipBtreeMutex == '\0') {
          btreeEnterAll(db);
        }
        pTVar6 = sqlite3LocateTable(pParse,0,local_60,local_38);
        if (pTVar6 == (Table *)0x0) {
LAB_00115a23:
          pTVar6 = (Table *)0x0;
        }
        else if ((pTVar6->tabFlags & 0x10) != 0) {
          sqlite3ErrorMsg(pParse,"cannot open virtual table: %s",local_60);
          goto LAB_00115a23;
        }
        if (pTVar6 == (Table *)0x0) {
LAB_00115a46:
          pTVar6 = (Table *)0x0;
        }
        else if ((pTVar6->tabFlags & 0x20) != 0) {
          sqlite3ErrorMsg(pParse,"cannot open table without rowid: %s",local_60);
          goto LAB_00115a46;
        }
        if (pTVar6 == (Table *)0x0) {
LAB_00115a6a:
          pTVar6 = (Table *)0x0;
        }
        else if (pTVar6->pSelect != (Select *)0x0) {
          sqlite3ErrorMsg(pParse,"cannot open view: %s",local_60);
          goto LAB_00115a6a;
        }
        if (pTVar6 == (Table *)0x0) {
          if (pParse->zErrMsg != (char *)0x0) {
            sqlite3DbFree(db,(void *)0x0);
            local_88 = pParse->zErrMsg;
            pParse->zErrMsg = (char *)0x0;
          }
          uVar1 = db->skipBtreeMutex;
joined_r0x00115e28:
          uVar14 = 1;
          if (uVar1 == '\0') {
            btreeLeaveAll(db);
            uVar14 = 1;
          }
          goto LAB_00115ea1;
        }
        pIVar17->pTab = pTVar6;
        if (pTVar6->pSchema == (Schema *)0x0) {
          uVar19 = 0xfff0bdc0;
        }
        else {
          uVar3 = db->nDb;
          if ((int)uVar3 < 1) {
            uVar19 = 0;
          }
          else {
            ppSVar13 = &db->aDb->pSchema;
            uVar11 = 0;
            do {
              uVar19 = uVar11;
              if (*ppSVar13 == pTVar6->pSchema) break;
              uVar11 = uVar11 + 1;
              ppSVar13 = ppSVar13 + 4;
              uVar19 = (ulong)uVar3;
            } while (uVar3 != uVar11);
          }
        }
        pIVar17->zDb = db->aDb[(int)uVar19].zDbSName;
        uVar3 = (uint)pTVar6->nCol;
        local_68 = pTVar6;
        if (pTVar6->nCol < 1) {
          uVar18 = 0;
        }
        else {
          pCVar15 = pTVar6->aCol;
          uVar19 = 0;
          do {
            iVar4 = sqlite3StrICmp(pCVar15->zName,local_50);
            if (iVar4 == 0) goto LAB_00115afb;
            uVar19 = uVar19 + 1;
            pCVar15 = pCVar15 + 1;
          } while (uVar3 != uVar19);
          uVar19 = (ulong)uVar3;
LAB_00115afb:
          uVar18 = (uint)uVar19;
        }
        pTVar6 = local_68;
        if (uVar18 == uVar3) {
          sqlite3DbFree(db,(void *)0x0);
          local_88 = sqlite3MPrintf(db,"no such column: \"%s\"",local_50);
          uVar1 = db->skipBtreeMutex;
          pParse = local_78;
          goto joined_r0x00115e28;
        }
        if (local_6c != 0) {
          if (((db->flags & 0x80000) == 0) || (pFVar7 = local_68->pFKey, pFVar7 == (FKey *)0x0)) {
            pcVar16 = (char *)0x0;
          }
          else {
            pcVar16 = (char *)0x0;
            do {
              if (0 < (long)pFVar7->nCol) {
                lVar12 = 0;
                do {
                  if (*(uint *)((long)&pFVar7->aCol[0].iFrom + lVar12) == uVar18) {
                    pcVar16 = "foreign key";
                  }
                  lVar12 = lVar12 + 0x10;
                } while ((long)pFVar7->nCol * 0x10 != lVar12);
              }
              pFVar7 = pFVar7->pNextFrom;
            } while (pFVar7 != (FKey *)0x0);
          }
          for (pIVar8 = local_68->pIndex; pIVar8 != (Index *)0x0; pIVar8 = pIVar8->pNext) {
            if ((ulong)pIVar8->nKeyCol != 0) {
              uVar19 = 0;
              do {
                if (uVar18 == (int)pIVar8->aiColumn[uVar19]) {
                  pcVar16 = "indexed";
                }
                if ((int)pIVar8->aiColumn[uVar19] == 0xfffffffe) {
                  pcVar16 = "indexed";
                }
                uVar19 = uVar19 + 1;
              } while (pIVar8->nKeyCol != uVar19);
            }
          }
          if (pcVar16 != (char *)0x0) {
            sqlite3DbFree(db,(void *)0x0);
            local_88 = sqlite3MPrintf(db,"cannot open %s column for writing",pcVar16);
            local_94 = 1;
            if (db->skipBtreeMutex == '\0') {
              btreeLeaveAll(db);
            }
          }
          pParse = local_78;
          uVar14 = local_94;
          if (pcVar16 != (char *)0x0) goto LAB_00115ea1;
        }
        pIVar17 = local_80;
        p_00 = sqlite3VdbeCreate(local_78);
        pIVar17->pStmt = (sqlite3_stmt *)p_00;
        if (p_00 != (Vdbe *)0x0) {
          pSVar2 = pTVar6->pSchema;
          if (pSVar2 == (Schema *)0x0) {
            uVar19 = 0xfff0bdc0;
          }
          else {
            uVar3 = db->nDb;
            if ((int)uVar3 < 1) {
              uVar19 = 0;
            }
            else {
              ppSVar13 = &db->aDb->pSchema;
              uVar19 = 0;
              do {
                if (*ppSVar13 == pSVar2) goto LAB_00115c4b;
                uVar19 = uVar19 + 1;
                ppSVar13 = ppSVar13 + 4;
              } while (uVar3 != uVar19);
              uVar19 = (ulong)uVar3;
            }
          }
LAB_00115c4b:
          iVar4 = pSVar2->iGeneration;
          p1 = (int)uVar19;
          iVar5 = sqlite3VdbeAddOp3(p_00,2,p1,(uint)(wrFlag != 0),pSVar2->schema_cookie);
          psVar10 = p_00->db;
          if (psVar10->mallocFailed == '\0') {
            psVar10 = (sqlite3 *)p_00->aOp;
            *(undefined1 *)((long)psVar10->aLimit + (long)iVar5 * 0x18 + -0x6f) = 0xf5;
            psVar10->aLimit[(long)iVar5 * 6 + -0x18] = iVar4;
          }
          if (0 < (long)p_00->nOp) {
            psVar10 = (sqlite3 *)p_00->aOp;
            *(undefined2 *)((long)psVar10 + ((long)p_00->nOp + -1) * 0x18 + 2) = 1;
          }
          pVVar9 = sqlite3VdbeAddOpList(p_00,6,sqlite3_blob_open::openBlob,(int)psVar10);
          uVar3 = 1 << ((byte)uVar19 & 0x1f);
          p_00->btreeMask = p_00->btreeMask | uVar3;
          if ((p1 != 1) && ((p_00->db->aDb[p1].pBt)->sharable != '\0')) {
            p_00->lockMask = p_00->lockMask | uVar3;
          }
          if (db->mallocFailed == '\0') {
            pVVar9->p1 = p1;
            pVVar9->p2 = local_68->tnum;
            pVVar9->p3 = (uint)(wrFlag != 0);
            local_48 = pVVar9;
            sqlite3VdbeChangeP4(p_00,1,local_68->zName,0);
            pVVar9 = local_48;
          }
          if (db->mallocFailed == '\0') {
            if (local_6c != 0) {
              pVVar9[1].opcode = 'i';
            }
            pVVar9[1].p2 = local_68->tnum;
            pVVar9[1].p3 = p1;
            pVVar9[1].p4type = -0xb;
            pVVar9[1].p4.i = local_68->nCol + 1;
            pVVar9[3].p2 = (int)local_68->nCol;
            local_78->nVar = 0;
            local_78->nTab = 1;
            local_78->nMem = 1;
            sqlite3VdbeMakeReady(p_00,local_78);
          }
        }
        pIVar17 = local_80;
        local_80->iCol = (u16)uVar18;
        local_80->db = db;
        if (db->skipBtreeMutex == '\0') {
          btreeLeaveAll(db);
        }
        pParse = local_78;
        uVar14 = local_94;
        if ((db->mallocFailed != '\0') ||
           (uVar14 = blobSeekToRow(pIVar17,local_40,&local_88), 0x30 < local_54)) goto LAB_00115ea1;
        uVar3 = local_54 + 1;
        local_94 = 0x11;
        if (uVar14 != 0x11) goto LAB_00115ea1;
      } while( true );
    }
  }
  pParse = (Parse *)0x0;
  uVar14 = 0;
LAB_00115ea1:
  pIVar17 = local_80;
  if ((uVar14 == 0) && (db->mallocFailed == '\0')) {
    *ppBlob = (sqlite3_blob *)local_80;
  }
  else {
    if ((local_80 != (Incrblob *)0x0) && ((Vdbe *)local_80->pStmt != (Vdbe *)0x0)) {
      sqlite3VdbeFinalize((Vdbe *)local_80->pStmt);
    }
    sqlite3DbFree(db,pIVar17);
  }
  p = local_88;
  pcVar16 = "%s";
  if (local_88 == (char *)0x0) {
    pcVar16 = (char *)0x0;
  }
  sqlite3ErrorWithMsg(db,uVar14,pcVar16,local_88);
  sqlite3DbFree(db,p);
  sqlite3ParserReset(pParse);
  sqlite3DbFree(db,pParse);
  if ((uVar14 == 0xc0a) || (db->mallocFailed != '\0')) {
    apiOomError(db);
    uVar14 = 7;
  }
  else {
    uVar14 = uVar14 & db->errMask;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar14;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(pParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      
      /* This VDBE program seeks a btree cursor to the identified 
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and 
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the 
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);     
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 1, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;   

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type 
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        pParse->nVar = 0;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(pParse);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}